

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
merlin::graphical_model::pseudo_tree
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          graphical_model *this,variable_order_t *order)

{
  double dVar1;
  bool bVar2;
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  ulong *puVar6;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  variable_set vi;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_d8;
  variable local_c0;
  variable local_b0;
  variable_set local_a0;
  variable_set local_68;
  
  local_a0.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict1 *)&local_a0,
             (allocator_type *)&local_68);
  mrf(&local_d8,this);
  puVar6 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar6 != puVar3) {
    do {
      if (*puVar6 < (ulong)((long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_vadj).
                                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        variable_set::variable_set
                  (&local_a0,
                   local_d8.
                   super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                   _M_impl.super__Vector_impl_data._M_start + *puVar6);
        if (local_a0.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_a0.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar5 = 0;
          do {
            variable_set::operator|=
                      (local_d8.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       local_a0.m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar5],&local_a0);
            local_b0.m_label = *puVar6;
            dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_b0.m_label];
            local_b0.m_states = (size_t)dVar1;
            local_b0.m_states =
                 (long)(dVar1 - 9.223372036854776e+18) & (long)local_b0.m_states >> 0x3f |
                 local_b0.m_states;
            local_c0.m_label =
                 local_a0.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5];
            local_c0.m_states = local_a0.m_d[lVar5];
            variable_set::variable_set(&local_68,&local_b0,&local_c0);
            variable_set::operator-=
                      (local_d8.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       local_a0.m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar5],&local_68);
            variable_set::~variable_set(&local_68);
            lVar5 = lVar5 + 1;
          } while (lVar5 != (long)local_a0.m_v.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a0.m_v.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3);
        }
        puVar3 = puVar6;
        if (puVar6 != (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_68.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*puVar3;
            dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(long)local_68.m_v.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start];
            uVar4 = (ulong)dVar1;
            local_68.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
            bVar2 = variable_set::contains(&local_a0,(variable *)&local_68);
            if (bVar2) {
              (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[*puVar6] = *puVar3;
              break;
            }
            puVar3 = puVar3 + 1;
          } while (puVar3 != (order->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish);
        }
        variable_set::~variable_set(&local_a0);
        puVar3 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar3);
  }
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<vindex> pseudo_tree(const variable_order_t& order) const {
		std::vector<vindex> parents(nvar(), -1);
		std::vector<variable_set> adj = mrf();

		// Eliminate in the given order of labels, tracking adjacency
		for (variable_order_t::const_iterator i = order.begin(); i != order.end(); ++i) {
			if (*i < 0 || *i >= nvar())
				continue;
			variable_set vi = adj[_vindex(var(*i))];
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				adj[_vindex(*j)] |= vi;
				adj[_vindex(*j)] -= variable_set(var(*i), *j);
			}

			for (variable_order_t::const_iterator k = i; k != order.end(); ++k) {
				if (vi.contains(var(*k))) {
					parents[*i] = *k;
					break;
				}
			}
		}
		return parents;
	}